

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O0

void __thiscall
PrintTuple<CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type>
::print_formatted(PrintTuple<CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type>
                  *this,Printer *p,char *s)

{
  char *local_20;
  char *s_local;
  Printer *p_local;
  PrintTuple<CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type>
  *this_local;
  
  local_20 = s;
  while( true ) {
    if (*local_20 == '\0') {
      return;
    }
    if ((*local_20 == '%') && (local_20 = local_20 + 1, *local_20 != '%')) break;
    Printer::print(p,*local_20);
    local_20 = local_20 + 1;
  }
  Printer::print<CodegenC::Type>(p,this->t0);
  PrintTuple<CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type>
  ::print_formatted(&this->t,p,local_20);
  return;
}

Assistant:

void print_formatted(const Printer& p, const char* s) const {
		while (*s) {
			if (*s == '%') {
				++s;
				if (*s != '%') {
					p.print(t0);
					t.print_formatted(p, s);
					return;
				}
			}
			p.print(*s);
			++s;
		}
	}